

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

sha1_hash * __thiscall
libtorrent::session_handle::dht_put_item
          (sha1_hash *__return_storage_ptr__,session_handle *this,entry *data)

{
  span<const_char> data_00;
  vector<char,_std::allocator<char>_> buf;
  hasher local_40;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bencode<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            ((vector<char,_std::allocator<char>_> *)&local_38,data);
  data_00.m_len =
       (long)local_38._M_impl.super__Vector_impl_data._M_finish -
       (long)local_38._M_impl.super__Vector_impl_data._M_start;
  data_00.m_ptr = local_38._M_impl.super__Vector_impl_data._M_start;
  lcrypto::hasher::hasher(&local_40,data_00);
  lcrypto::hasher::final(__return_storage_ptr__,&local_40);
  lcrypto::hasher::~hasher(&local_40);
  async_call<void(libtorrent::aux::session_impl::*)(libtorrent::entry_const&,libtorrent::digest32<160l>),libtorrent::entry&,libtorrent::digest32<160l>const&>
            (this,0x296950,(entry *)0x0,(digest32<160L> *)data);
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

sha1_hash session_handle::dht_put_item(entry data)
	{
		std::vector<char> buf;
		bencode(std::back_inserter(buf), data);
		sha1_hash const ret = hasher(buf).final();

#ifndef TORRENT_DISABLE_DHT
		async_call(&session_impl::dht_put_immutable_item, data, ret);
#endif
		return ret;
	}